

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O1

pcp_errno pcp_db_foreach_flow(pcp_ctx_t *ctx,pcp_db_flow_iterate f,void *data)

{
  pcp_flow_s *ppVar1;
  int iVar2;
  pcp_flow_t *ppVar3;
  long lVar4;
  
  if ((ctx != (pcp_ctx_t *)0x0) && (f != (pcp_db_flow_iterate)0x0)) {
    lVar4 = 0;
    do {
      ppVar3 = (ctx->pcp_db).flows[lVar4];
      while (ppVar3 != (pcp_flow_t *)0x0) {
        ppVar1 = ppVar3->next;
        iVar2 = (*f)(ppVar3,data);
        ppVar3 = ppVar1;
        if (iVar2 != 0) {
          return PCP_ERR_SUCCESS;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x40);
    return PCP_ERR_NOT_FOUND;
  }
  __assert_fail("f && ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/lib/src/pcp_client_db.c"
                ,0xd8,"pcp_errno pcp_db_foreach_flow(pcp_ctx_t *, pcp_db_flow_iterate, void *)");
}

Assistant:

pcp_errno pcp_db_foreach_flow(pcp_ctx_t *ctx, pcp_db_flow_iterate f,
                              void *data) {
    pcp_flow_t *fdb, *fdb_next = NULL;
    uint32_t indx;

    assert(f && ctx);

    for (indx = 0; indx < FLOW_HASH_SIZE; ++indx) {
        fdb = ctx->pcp_db.flows[indx];
        while (fdb != NULL) {
            fdb_next = (fdb->next);
            if ((*f)(fdb, data)) {
                return PCP_ERR_SUCCESS;
            }
            fdb = fdb_next;
        }
    }

    return PCP_ERR_NOT_FOUND;
}